

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_update_texture
               (uint id,int width,int height,rf_pixel_format format,void *pixels,int pixels_size)

{
  uint uVar1;
  int iVar2;
  rf_gfx_pixel_format rVar3;
  
  uVar1 = format - RF_UNCOMPRESSED_GRAYSCALE;
  iVar2 = 0;
  if (uVar1 < 10) {
    iVar2 = *(int *)(&DAT_0017a7c8 + (ulong)uVar1 * 4);
  }
  if (pixels_size < height * width * iVar2) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,id);
    rVar3 = rf_gfx_get_internal_texture_formats(format);
    if (uVar1 < 10 && (rVar3._8_8_ >> 0x20 & 1) != 0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexSubImage2D)
                (0xde1,0,0,0,width,height,rVar3.internal_format,rVar3.type,pixels);
    }
    else {
      rf_log_impl(4,0x17c789);
    }
  }
  return;
}

Assistant:

RF_API void rf_gfx_update_texture(unsigned int id, int width, int height, rf_pixel_format format, const void* pixels, int pixels_size)
{
    if (width * height * rf_bytes_per_pixel(format) <= pixels_size) return;

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    rf_gfx_pixel_format gfx_format = rf_gfx_get_internal_texture_formats(format);

    if (gfx_format.valid && rf_is_uncompressed_format(format))
    {
        rf_gl.TexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, width, height, gfx_format.internal_format, gfx_format.type, (unsigned char*) pixels);
    }
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture format updating not supported");
}